

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool bssl::ssl_select_ech_config(SSL_HANDSHAKE *hs,Span<unsigned_char> out_enc,size_t *out_enc_len)

{
  EVP_HPKE_AEAD *aead_00;
  EVP_HPKE_KDF *kem_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  pointer pSVar4;
  cbb_st *pcVar5;
  uchar *puVar6;
  evp_hpke_ctx_st *ctx;
  size_t max_enc;
  uchar *peer_public_key;
  size_t peer_public_key_len;
  uint8_t *info_00;
  size_t info_len;
  EVP_HPKE_AEAD *in_R9;
  Span<const_unsigned_char> cipher_suites;
  uint local_154;
  unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter> local_138;
  undefined1 local_130 [8];
  ScopedCBB info;
  EVP_HPKE_AEAD *local_f0;
  EVP_HPKE_AEAD *aead;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_KEM *kem;
  bool local_c1;
  undefined1 local_c0 [7];
  bool supported;
  ECHConfig ech_config;
  CBS child;
  undefined1 local_58 [8];
  CBS cbs;
  size_t *out_enc_len_local;
  SSL_HANDSHAKE *hs_local;
  Span<unsigned_char> out_enc_local;
  
  out_enc_local.data_ = (uchar *)out_enc.size_;
  hs_local = (SSL_HANDSHAKE *)out_enc.data_;
  *out_enc_len = 0;
  if (hs->max_version < 0x304) {
    out_enc_local.size_._7_1_ = 1;
  }
  else {
    cbs.len = (size_t)out_enc_len;
    bVar1 = Array<unsigned_char>::empty(&hs->config->client_ech_config_list);
    if (bVar1) {
LAB_0015a26b:
      out_enc_local.size_._7_1_ = 1;
    }
    else {
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)&child.len,&hs->config->client_ech_config_list);
      cbs_st::cbs_st((cbs_st *)local_58,stack0xffffffffffffff98);
      iVar2 = CBS_get_u16_length_prefixed((CBS *)local_58,(CBS *)&ech_config.kem_id);
      if (((iVar2 == 0) || (sVar3 = CBS_len((CBS *)&ech_config.kem_id), sVar3 == 0)) ||
         (sVar3 = CBS_len((CBS *)local_58), sVar3 != 0)) {
        out_enc_local.size_._7_1_ = 0;
      }
      else {
        do {
          sVar3 = CBS_len((CBS *)&ech_config.kem_id);
          if (sVar3 == 0) goto LAB_0015a26b;
          ECHConfig::ECHConfig((ECHConfig *)local_c0);
          bVar1 = parse_ech_config((CBS *)&ech_config.kem_id,(ECHConfig *)local_c0,&local_c1,false);
          if (bVar1) {
            kdf = (EVP_HPKE_KDF *)EVP_hpke_x25519_hkdf_sha256();
            puVar6 = ech_config.cipher_suites.data_;
            if (((local_c1 & 1U) != 0) && ((short)ech_config.cipher_suites.size_ == 0x20)) {
              info.ctx_.u._24_8_ = ech_config.public_name.size_;
              pSVar4 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                                 (&hs->ssl->config);
              if ((*(ushort *)&pSVar4->field_0x10d >> 0xb & 1) == 0) {
                local_154 = EVP_has_aes_hardware();
              }
              else {
                pSVar4 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                                   (&hs->ssl->config);
                local_154 = (uint)((byte)((ushort)*(undefined2 *)&pSVar4->field_0x10d >> 0xc) & 1);
              }
              cipher_suites.size_._0_1_ = local_154 != 0;
              cipher_suites.data_ = puVar6;
              cipher_suites.size_._1_7_ = 0;
              bVar1 = select_ech_cipher_suite
                                ((bssl *)&aead,(EVP_HPKE_KDF **)&local_f0,
                                 (EVP_HPKE_AEAD **)info.ctx_.u._24_8_,cipher_suites,SUB81(in_R9,0));
              if (bVar1) {
                internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
                          ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_130);
                pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                   ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                    local_130);
                sVar3 = Array<unsigned_char>::size((Array<unsigned_char> *)local_c0);
                iVar2 = CBB_init(pcVar5,sVar3 + 8);
                if (iVar2 == 0) {
LAB_00159ff4:
                  out_enc_local.size_._7_1_ = false;
                }
                else {
                  pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                      local_130);
                  iVar2 = CBB_add_bytes(pcVar5,"tls ech",8);
                  if (iVar2 == 0) goto LAB_00159ff4;
                  pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                      local_130);
                  puVar6 = Array<unsigned_char>::data((Array<unsigned_char> *)local_c0);
                  sVar3 = Array<unsigned_char>::size((Array<unsigned_char> *)local_c0);
                  iVar2 = CBB_add_bytes(pcVar5,puVar6,sVar3);
                  if (iVar2 == 0) goto LAB_00159ff4;
                  ctx = internal::
                        StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                        ::get(&hs->ech_hpke_ctx);
                  puVar6 = Span<unsigned_char>::data((Span<unsigned_char> *)&hs_local);
                  sVar3 = cbs.len;
                  max_enc = Span<unsigned_char>::size((Span<unsigned_char> *)&hs_local);
                  kem_00 = kdf;
                  in_R9 = aead;
                  aead_00 = local_f0;
                  peer_public_key =
                       Span<const_unsigned_char>::data
                                 ((Span<const_unsigned_char> *)&ech_config.raw.size_);
                  peer_public_key_len =
                       Span<const_unsigned_char>::size
                                 ((Span<const_unsigned_char> *)&ech_config.raw.size_);
                  pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                      local_130);
                  info_00 = CBB_data(pcVar5);
                  pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                      local_130);
                  info_len = CBB_len(pcVar5);
                  iVar2 = EVP_HPKE_CTX_setup_sender
                                    (ctx,puVar6,(size_t *)sVar3,max_enc,(EVP_HPKE_KEM *)kem_00,
                                     (EVP_HPKE_KDF *)in_R9,aead_00,peer_public_key,
                                     peer_public_key_len,info_00,info_len);
                  if ((iVar2 == 0) || (bVar1 = SSLTranscript::Init(&hs->inner_transcript), !bVar1))
                  {
                    out_enc_local.size_._7_1_ = false;
                  }
                  else {
                    MakeUnique<bssl::ECHConfig,bssl::ECHConfig>
                              ((bssl *)&local_138,(ECHConfig *)local_c0);
                    std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::operator=
                              (&hs->selected_ech_config,&local_138);
                    std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::~unique_ptr
                              (&local_138);
                    out_enc_local.size_._7_1_ =
                         std::operator!=(&hs->selected_ech_config,(nullptr_t)0x0);
                  }
                }
                kem._0_4_ = 1;
                internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                          ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_130);
                goto LAB_0015a23c;
              }
            }
            kem._0_4_ = 0;
          }
          else {
            out_enc_local.size_._7_1_ = 0;
            kem._0_4_ = 1;
          }
LAB_0015a23c:
          ECHConfig::~ECHConfig((ECHConfig *)local_c0);
        } while ((int)kem == 0);
      }
    }
  }
  return (bool)(out_enc_local.size_._7_1_ & 1);
}

Assistant:

bool ssl_select_ech_config(SSL_HANDSHAKE *hs, Span<uint8_t> out_enc,
                           size_t *out_enc_len) {
  *out_enc_len = 0;
  if (hs->max_version < TLS1_3_VERSION) {
    // ECH requires TLS 1.3.
    return true;
  }

  if (!hs->config->client_ech_config_list.empty()) {
    CBS cbs = CBS(hs->config->client_ech_config_list);
    CBS child;
    if (!CBS_get_u16_length_prefixed(&cbs, &child) ||  //
        CBS_len(&child) == 0 ||                        //
        CBS_len(&cbs) > 0) {
      return false;
    }
    // Look for the first ECHConfig with supported parameters.
    while (CBS_len(&child) > 0) {
      ECHConfig ech_config;
      bool supported;
      if (!parse_ech_config(&child, &ech_config, &supported,
                            /*all_extensions_mandatory=*/false)) {
        return false;
      }
      const EVP_HPKE_KEM *kem = EVP_hpke_x25519_hkdf_sha256();
      const EVP_HPKE_KDF *kdf;
      const EVP_HPKE_AEAD *aead;
      if (supported &&  //
          ech_config.kem_id == EVP_HPKE_DHKEM_X25519_HKDF_SHA256 &&
          select_ech_cipher_suite(&kdf, &aead, ech_config.cipher_suites,
                                  hs->ssl->config->aes_hw_override
                                      ? hs->ssl->config->aes_hw_override_value
                                      : EVP_has_aes_hardware())) {
        ScopedCBB info;
        static const uint8_t kInfoLabel[] = "tls ech";  // includes trailing NUL
        if (!CBB_init(info.get(), sizeof(kInfoLabel) + ech_config.raw.size()) ||
            !CBB_add_bytes(info.get(), kInfoLabel, sizeof(kInfoLabel)) ||
            !CBB_add_bytes(info.get(), ech_config.raw.data(),
                           ech_config.raw.size())) {
          return false;
        }

        if (!EVP_HPKE_CTX_setup_sender(
                hs->ech_hpke_ctx.get(), out_enc.data(), out_enc_len,
                out_enc.size(), kem, kdf, aead, ech_config.public_key.data(),
                ech_config.public_key.size(), CBB_data(info.get()),
                CBB_len(info.get())) ||
            !hs->inner_transcript.Init()) {
          return false;
        }

        hs->selected_ech_config = MakeUnique<ECHConfig>(std::move(ech_config));
        return hs->selected_ech_config != nullptr;
      }
    }
  }

  return true;
}